

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tearing.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  int iVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLint GVar6;
  GLFWwindow *handle;
  undefined1 *puVar7;
  vec4 *pafVar8;
  int i;
  long lVar9;
  vec4 *pafVar10;
  int i_1;
  long lVar11;
  undefined8 *puVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  int height;
  int width;
  double local_148;
  GLuint vertex_buffer;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8 [48];
  float local_c8;
  undefined8 local_c4;
  mat4x4 temp;
  mat4x4 mvp;
  
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 != 0) {
    glfwWindowHint(0x22002,2);
    glfwWindowHint(0x22003,0);
    handle = glfwCreateWindow(0x280,0x1e0,"Tearing detector",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      gladLoadGL(glfwGetProcAddress);
      set_swap_interval(handle,0);
      local_148 = glfwGetTime();
      frame_rate = 0.0;
      iVar2 = glfwExtensionSupported("WGL_EXT_swap_control_tear");
      if (iVar2 == 0) {
        iVar2 = glfwExtensionSupported("GLX_EXT_swap_control_tear");
        swap_tear = (int)(iVar2 != 0);
      }
      else {
        swap_tear = 1;
      }
      glfwSetKeyCallback(handle,key_callback);
      (*glad_glGenBuffers)(1,&vertex_buffer);
      (*glad_glBindBuffer)(0x8892,vertex_buffer);
      (*glad_glBufferData)(0x8892,0x20,vertices,0x88e4);
      GVar3 = (*glad_glCreateShader)(0x8b31);
      lVar14 = 0;
      (*glad_glShaderSource)(GVar3,1,&vertex_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar3);
      GVar4 = (*glad_glCreateShader)(0x8b30);
      (*glad_glShaderSource)(GVar4,1,&fragment_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar4);
      GVar5 = (*glad_glCreateProgram)();
      (*glad_glAttachShader)(GVar5,GVar3);
      (*glad_glAttachShader)(GVar5,GVar4);
      (*glad_glLinkProgram)(GVar5);
      GVar6 = (*glad_glGetUniformLocation)(GVar5,"MVP");
      GVar3 = (*glad_glGetAttribLocation)(GVar5,"vPos");
      (*glad_glEnableVertexAttribArray)(GVar3);
      (*glad_glVertexAttribPointer)(GVar3,2,0x1406,'\0',8,(void *)0x0);
      while( true ) {
        iVar2 = glfwWindowShouldClose(handle);
        if (iVar2 != 0) break;
        dVar1 = glfwGetTime();
        fVar15 = cosf((float)dVar1 * 4.0);
        glfwGetFramebufferSize(handle,&width,&height);
        (*glad_glViewport)(0,0,width,height);
        (*glad_glClear)(0x4000);
        local_138 = 0x3f800000;
        uStack_130 = 0;
        local_128 = 0x3f80000000000000;
        uStack_120 = 0;
        local_118 = 0;
        uStack_110 = 0xc0000000;
        local_108 = 0x8000000080000000;
        uStack_100 = 0x3f800000bf800000;
        puVar7 = local_f8;
        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
          for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
            uVar16 = 0x3f800000;
            if (lVar9 != lVar11) {
              uVar16 = 0;
            }
            *(undefined4 *)(puVar7 + lVar11 * 4) = uVar16;
          }
          puVar7 = puVar7 + 0x10;
        }
        local_c8 = fVar15 * 0.75;
        local_c4 = 0;
        puVar7 = local_f8;
        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
          puVar12 = &local_138;
          for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
            fVar15 = 0.0;
            for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 4) {
              fVar15 = fVar15 + *(float *)((long)puVar12 + lVar13 * 4) * *(float *)(puVar7 + lVar13)
              ;
            }
            temp[lVar9][lVar11] = fVar15;
            puVar12 = (undefined8 *)((long)puVar12 + 4);
          }
          puVar7 = puVar7 + 0x10;
        }
        pafVar8 = temp;
        pafVar10 = mvp;
        for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
          for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
            (*pafVar10)[lVar11] = (*pafVar8)[lVar11];
          }
          pafVar10 = pafVar10 + 1;
          pafVar8 = pafVar8 + 1;
        }
        (*glad_glUseProgram)(GVar5);
        (*glad_glUniformMatrix4fv)(GVar6,1,'\0',mvp[0]);
        (*glad_glDrawArrays)(6,0,4);
        glfwSwapBuffers(handle);
        glfwPollEvents();
        lVar14 = lVar14 + 1;
        dVar1 = glfwGetTime();
        if (1.0 < dVar1 - local_148) {
          auVar17._8_4_ = (int)((ulong)lVar14 >> 0x20);
          auVar17._0_8_ = lVar14;
          auVar17._12_4_ = 0x45300000;
          frame_rate = ((auVar17._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) /
                       (dVar1 - local_148);
          update_window_title(handle);
          lVar14 = 0;
          local_148 = dVar1;
        }
      }
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    unsigned long frame_count = 0;
    double last_time, current_time;
    GLFWwindow* window;
    GLuint vertex_buffer, vertex_shader, fragment_shader, program;
    GLint mvp_location, vpos_location;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    window = glfwCreateWindow(640, 480, "Tearing detector", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);
    set_swap_interval(window, 0);

    last_time = glfwGetTime();
    frame_rate = 0.0;
    swap_tear = (glfwExtensionSupported("WGL_EXT_swap_control_tear") ||
                 glfwExtensionSupported("GLX_EXT_swap_control_tear"));

    glfwSetKeyCallback(window, key_callback);

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    mvp_location = glGetUniformLocation(program, "MVP");
    vpos_location = glGetAttribLocation(program, "vPos");

    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vertices[0]), (void*) 0);

    while (!glfwWindowShouldClose(window))
    {
        int width, height;
        mat4x4 m, p, mvp;
        float position = cosf((float) glfwGetTime() * 4.f) * 0.75f;

        glfwGetFramebufferSize(window, &width, &height);

        glViewport(0, 0, width, height);
        glClear(GL_COLOR_BUFFER_BIT);

        mat4x4_ortho(p, -1.f, 1.f, -1.f, 1.f, 0.f, 1.f);
        mat4x4_translate(m, position, 0.f, 0.f);
        mat4x4_mul(mvp, p, m);

        glUseProgram(program);
        glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
        glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

        glfwSwapBuffers(window);
        glfwPollEvents();

        frame_count++;

        current_time = glfwGetTime();
        if (current_time - last_time > 1.0)
        {
            frame_rate = frame_count / (current_time - last_time);
            frame_count = 0;
            last_time = current_time;
            update_window_title(window);
        }
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}